

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O2

lyplg_ext_sprinter_tree_node_override *
tro_set_node_overr(ly_bool lysc_tree,void *node,ly_bool erase_node_overr,trt_plugin_ctx *plc)

{
  lyspr_tree_ctx *plVar1;
  lyplg_ext_sprinter_ctree_override_clb p_Var2;
  LY_ERR LVar3;
  long *plVar4;
  void *pvVar5;
  undefined7 in_register_00000011;
  lyplg_ext_sprinter_tree_node_override *plVar6;
  
  if ((int)CONCAT71(in_register_00000011,erase_node_overr) != 0) {
    plc->filtered = '\0';
    (plc->node_overr).flags = (char *)0x0;
    (plc->node_overr).add_opts = (char *)0x0;
  }
  plVar6 = &plc->node_overr;
  plVar1 = plc->ctx;
  if (lysc_tree == '\0' || plVar1 != (lyspr_tree_ctx *)0x0) {
    if (plVar1 != (lyspr_tree_ctx *)0x0) {
      if ((plc->schema == (lyspr_tree_schema *)0x0) ||
         (p_Var2 = (plc->schema->field_2).cn_overr,
         p_Var2 == (lyplg_ext_sprinter_ctree_override_clb)0x0)) {
        plVar6 = (lyplg_ext_sprinter_tree_node_override *)0x0;
        LVar3 = LY_SUCCESS;
      }
      else {
        LVar3 = (*p_Var2)((lysc_node *)node,plVar1->plugin_priv,&plc->filtered,&plVar6->flags,
                          &(plc->node_overr).add_opts);
      }
      pvVar5 = trp_ext_is_present(lysc_tree,node);
      if (pvVar5 != (void *)0x0) {
        plVar1 = plc->ctx;
        plc->ctx = (lyspr_tree_ctx *)0x0;
        tro_set_node_overr(lysc_tree,node,'\0',plc);
        plc->ctx = plVar1;
      }
      goto LAB_0018ee09;
    }
  }
  else {
    plVar4 = (long *)trp_ext_is_present(lysc_tree,node);
    if (plVar4 != (long *)0x0) {
      LVar3 = (**(code **)(*(long *)(*plVar4 + 0x18) + 0x20))
                        (plVar4,0,plVar6,&(plc->node_overr).add_opts);
      goto LAB_0018ee09;
    }
  }
  pvVar5 = trp_ext_is_present(lysc_tree,node);
  if (pvVar5 == (void *)0x0) {
    return (lyplg_ext_sprinter_tree_node_override *)0x0;
  }
  LVar3 = (**(code **)(*(long *)((long)pvVar5 + 0x48) + 0x40))
                    (pvVar5,0,plVar6,&(plc->node_overr).add_opts);
LAB_0018ee09:
  if (LVar3 != LY_SUCCESS) {
    plc->last_error = (ly_bool)LVar3;
    return (lyplg_ext_sprinter_tree_node_override *)0x0;
  }
  return plVar6;
}

Assistant:

static struct lyplg_ext_sprinter_tree_node_override *
tro_set_node_overr(ly_bool lysc_tree, const void *node, ly_bool erase_node_overr, struct trt_plugin_ctx *plc)
{
    LY_ERR rc = LY_SUCCESS;
    struct lyplg_ext_sprinter_tree_node_override *no;
    struct lyspr_tree_ctx *plug_ctx;
    struct lysc_ext_instance *ce;
    struct lysp_ext_instance *pe;

    if (erase_node_overr) {
        trp_ext_free_node_override(&plc->node_overr, &plc->filtered);
    }
    no = &plc->node_overr;
    if (!plc->ctx && lysc_tree && (ce = trp_ext_is_present(lysc_tree, node))) {
        rc = ce->def->plugin->printer_ctree(ce, NULL, &no->flags, &no->add_opts);
    } else if (!plc->ctx && (pe = trp_ext_is_present(lysc_tree, node))) {
        rc = pe->record->plugin.printer_ptree(pe, NULL, &no->flags, &no->add_opts);
    } else if (plc->ctx) {
        if (plc->schema && plc->schema->compiled && plc->schema->cn_overr) {
            rc = plc->schema->cn_overr(node, plc->ctx->plugin_priv, &plc->filtered, &no->flags, &no->add_opts);
        } else if (plc->schema && plc->schema->pn_overr) {
            rc = plc->schema->pn_overr(node, plc->ctx->plugin_priv, &plc->filtered, &no->flags, &no->add_opts);
        } else {
            no = NULL;
        }
        if (trp_ext_is_present(lysc_tree, node)) {
            plug_ctx = plc->ctx;
            plc->ctx = NULL;
            tro_set_node_overr(lysc_tree, node, 0, plc);
            plc->ctx = plug_ctx;
        }
    } else {
        no = NULL;
    }

    if (rc) {
        plc->last_error = rc;
        no = NULL;
    }

    return no;
}